

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

uint8_t equal_docs(fdb_doc *doc,docio_object *_doc)

{
  int iVar1;
  long in_RSI;
  size_t *in_RDI;
  uint8_t rv;
  bool local_11;
  
  local_11 = true;
  if (in_RDI[5] == 0xffffffffffffffff) {
    if (((in_RDI[4] != 0) &&
        (iVar1 = memcmp((void *)in_RDI[4],*(void **)(in_RSI + 0x18),*in_RDI), iVar1 != 0)) ||
       ((in_RDI[7] != 0 &&
        (iVar1 = memcmp((void *)in_RDI[7],*(void **)(in_RSI + 0x28),in_RDI[1]), iVar1 != 0)))) {
      free(*(void **)(in_RSI + 0x18));
      free(*(void **)(in_RSI + 0x28));
      free(*(void **)(in_RSI + 0x30));
      *(undefined8 *)(in_RSI + 0x30) = 0;
      *(undefined8 *)(in_RSI + 0x28) = 0;
      *(undefined8 *)(in_RSI + 0x18) = 0;
      local_11 = false;
    }
  }
  else {
    local_11 = in_RDI[5] != *(size_t *)(in_RSI + 0x20);
    if (local_11) {
      free(*(void **)(in_RSI + 0x18));
      free(*(void **)(in_RSI + 0x28));
      free(*(void **)(in_RSI + 0x30));
      *(undefined8 *)(in_RSI + 0x30) = 0;
      *(undefined8 *)(in_RSI + 0x28) = 0;
      *(undefined8 *)(in_RSI + 0x18) = 0;
    }
    local_11 = !local_11;
  }
  return local_11;
}

Assistant:

static uint8_t equal_docs(fdb_doc *doc, struct docio_object *_doc) {
    uint8_t rv = 1;
    // Compare a seq num if seq tree is enabled.
    if (doc->seqnum != SEQNUM_NOT_USED) {
        if (doc->seqnum != _doc->seqnum) {
            free(_doc->key);
            free(_doc->meta);
            free(_doc->body);
            _doc->key = _doc->meta = _doc->body = NULL;
            rv = 0;
        }
    } else { // Compare key and metadata
        if ((doc->key && memcmp(doc->key, _doc->key, doc->keylen)) ||
            (doc->meta && memcmp(doc->meta, _doc->meta, doc->metalen))) {
            free(_doc->key);
            free(_doc->meta);
            free(_doc->body);
            _doc->key = _doc->meta = _doc->body = NULL;
            rv = 0;
        }
    }
    return rv;
}